

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockCallTest_expectOneCallInScopeButNotHappen_TestShell::createTest
          (TEST_MockCallTest_expectOneCallInScopeButNotHappen_TestShell *this)

{
  Utest *this_00;
  TEST_MockCallTest_expectOneCallInScopeButNotHappen_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0x65);
  TEST_MockCallTest_expectOneCallInScopeButNotHappen_Test::
  TEST_MockCallTest_expectOneCallInScopeButNotHappen_Test
            ((TEST_MockCallTest_expectOneCallInScopeButNotHappen_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, expectOneCallInScopeButNotHappen)
{

    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("scope::foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock("scope").expectOneCall("foobar");
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

}